

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O0

char * Kit_PlaFromIsop(Vec_Str_t *vStr,int nVars,Vec_Int_t *vCover)

{
  int iVar1;
  uint uVar2;
  int Literal;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vCover_local;
  int nVars_local;
  Vec_Str_t *vStr_local;
  
  iVar1 = Vec_IntSize(vCover);
  if (iVar1 < 1) {
    __assert_fail("Vec_IntSize(vCover) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                  ,0x171,"char *Kit_PlaFromIsop(Vec_Str_t *, int, Vec_Int_t *)");
  }
  iVar1 = Vec_IntSize(vCover);
  if (iVar1 == 0) {
    vStr_local = (Vec_Str_t *)0x0;
  }
  else {
    Vec_StrClear(vStr);
    for (Entry = 0; iVar1 = Vec_IntSize(vCover), Entry < iVar1; Entry = Entry + 1) {
      iVar1 = Vec_IntEntry(vCover,Entry);
      for (Literal = 0; Literal < nVars; Literal = Literal + 1) {
        uVar2 = iVar1 >> ((byte)(Literal << 1) & 0x1f) & 3;
        if (uVar2 == 1) {
          Vec_StrPush(vStr,'0');
        }
        else if (uVar2 == 2) {
          Vec_StrPush(vStr,'1');
        }
        else {
          if (uVar2 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                          ,0x181,"char *Kit_PlaFromIsop(Vec_Str_t *, int, Vec_Int_t *)");
          }
          Vec_StrPush(vStr,'-');
        }
      }
      Vec_StrPush(vStr,' ');
      Vec_StrPush(vStr,'1');
      Vec_StrPush(vStr,'\n');
    }
    Vec_StrPush(vStr,'\0');
    vStr_local = (Vec_Str_t *)Vec_StrArray(vStr);
  }
  return (char *)vStr_local;
}

Assistant:

char * Kit_PlaFromIsop( Vec_Str_t * vStr, int nVars, Vec_Int_t * vCover )
{
    int i, k, Entry, Literal;
    assert( Vec_IntSize(vCover) > 0 );
    if ( Vec_IntSize(vCover) == 0 )
        return NULL;
    Vec_StrClear( vStr );
    Vec_IntForEachEntry( vCover, Entry, i )
    {
        for ( k = 0; k < nVars; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 )
                Vec_StrPush( vStr, '0' );
            else if ( Literal == 2 )
                Vec_StrPush( vStr, '1' );
            else if ( Literal == 0 )
                Vec_StrPush( vStr, '-' );
            else
                assert( 0 );
        }
        Vec_StrPush( vStr, ' ' );
        Vec_StrPush( vStr, '1' );
        Vec_StrPush( vStr, '\n' );
    }
    Vec_StrPush( vStr, '\0' );
    return Vec_StrArray( vStr );
}